

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O2

void __thiscall Catch::JunitReporter::writeAssertion(JunitReporter *this,AssertionStats *stats)

{
  OfType OVar1;
  size_type sVar2;
  pointer pMVar3;
  StringRef attribute;
  StringRef text;
  ostream *os;
  bool bVar4;
  ReusableStringStream *this_00;
  XmlWriter *this_01;
  MessageInfo *msg;
  pointer pMVar5;
  StringRef name;
  StringRef name_00;
  ReusableStringStream rss;
  Column local_b0;
  ScopedElement e;
  string elementName;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48 [2];
  
  OVar1 = (stats->assertionResult).m_resultData.resultType;
  if (((OVar1 & FailureBit) == Ok) ||
     (((stats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)) {
    if (OVar1 != ExplicitSkip) {
      return;
    }
  }
  else {
    elementName._M_dataplus._M_p = (pointer)&elementName.field_2;
    elementName._M_string_length = 0;
    elementName.field_2._M_local_buf[0] = '\0';
    if ((((1 < (uint)(OVar1 + ~FailureBit)) && (OVar1 != Unknown)) && (OVar1 != FailureBit)) &&
       (((OVar1 != Exception && (OVar1 != FatalErrorCondition)) &&
        ((OVar1 != DidntThrowException && (OVar1 != ThrewException)))))) goto LAB_00131e77;
  }
  elementName._M_dataplus._M_p = (pointer)&elementName.field_2;
  elementName.field_2._M_local_buf[0] = '\0';
  elementName._M_string_length = 0;
  std::__cxx11::string::assign((char *)&elementName);
LAB_00131e77:
  this_01 = &this->xml;
  XmlWriter::scopedElement((XmlWriter *)&e,(string *)this_01,(XmlFormatting)&elementName);
  AssertionResult::getExpression_abi_cxx11_(&local_b0.m_string,&stats->assertionResult);
  attribute.m_size = local_b0.m_string._M_string_length;
  attribute.m_start = local_b0.m_string._M_dataplus._M_p;
  name.m_size = 7;
  name.m_start = "message";
  XmlWriter::writeAttribute(this_01,name,attribute);
  std::__cxx11::string::~string((string *)&local_b0);
  name_00.m_size = 4;
  name_00.m_start = "type";
  XmlWriter::writeAttribute(this_01,name_00,(stats->assertionResult).m_info.macroName);
  ReusableStringStream::ReusableStringStream(&rss);
  os = rss.m_oss;
  if ((stats->assertionResult).m_resultData.resultType == ExplicitSkip) {
    std::operator<<(rss.m_oss,"SKIPPED\n");
  }
  else {
    std::operator<<(rss.m_oss,"FAILED");
    std::operator<<(os,":\n");
    if ((stats->assertionResult).m_info.capturedExpression.m_size != 0) {
      std::operator<<(os,"  ");
      AssertionResult::getExpressionInMacro_abi_cxx11_(&local_b0.m_string,&stats->assertionResult);
      std::operator<<(os,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::operator<<(os,'\n');
    }
    bVar4 = AssertionResult::hasExpandedExpression(&stats->assertionResult);
    if (bVar4) {
      std::operator<<(os,"with expansion:\n");
      AssertionResult::getExpandedExpression_abi_cxx11_((string *)local_48,&stats->assertionResult);
      TextFlow::Column::Column(&local_b0,(string *)local_48);
      local_b0.m_indent = 2;
      TextFlow::operator<<(os,&local_b0);
      std::operator<<(os,'\n');
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)local_48[0]._M_local_buf);
    }
  }
  sVar2 = (stats->assertionResult).m_resultData.message._M_string_length;
  if (sVar2 != 0) {
    local_b0.m_string._M_dataplus._M_p =
         (stats->assertionResult).m_resultData.message._M_dataplus._M_p;
    local_b0.m_string._M_string_length = sVar2;
    this_00 = ReusableStringStream::operator<<(&rss,(StringRef *)&local_b0);
    local_48[0]._M_local_buf[0] = '\n';
    ReusableStringStream::operator<<(this_00,local_48[0]._M_local_buf);
  }
  pMVar3 = (stats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pMVar5 = (stats->infoMessages).
                super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
                super__Vector_impl_data._M_start; pMVar5 != pMVar3; pMVar5 = pMVar5 + 1) {
    if (pMVar5->type == Info) {
      std::operator<<(rss.m_oss,(string *)&pMVar5->message);
      std::operator<<(rss.m_oss,'\n');
    }
  }
  std::operator<<(rss.m_oss,"at ");
  local_b0.m_string._M_dataplus._M_p = (stats->assertionResult).m_info.lineInfo.file;
  local_b0.m_string._M_string_length = (stats->assertionResult).m_info.lineInfo.line;
  Catch::operator<<(rss.m_oss,(SourceLineInfo *)&local_b0);
  std::__cxx11::stringbuf::str();
  text.m_size = local_b0.m_string._M_string_length;
  text.m_start = local_b0.m_string._M_dataplus._M_p;
  XmlWriter::writeText(this_01,text,Newline);
  std::__cxx11::string::~string((string *)&local_b0);
  ReusableStringStream::~ReusableStringStream(&rss);
  XmlWriter::ScopedElement::~ScopedElement(&e);
  std::__cxx11::string::~string((string *)&elementName);
  return;
}

Assistant:

void JunitReporter::writeAssertion( AssertionStats const& stats ) {
        AssertionResult const& result = stats.assertionResult;
        if ( !result.isOk() ||
             result.getResultType() == ResultWas::ExplicitSkip ) {
            std::string elementName;
            switch( result.getResultType() ) {
                case ResultWas::ThrewException:
                case ResultWas::FatalErrorCondition:
                    elementName = "error";
                    break;
                case ResultWas::ExplicitFailure:
                case ResultWas::ExpressionFailed:
                case ResultWas::DidntThrowException:
                    elementName = "failure";
                    break;
                case ResultWas::ExplicitSkip:
                    elementName = "skipped";
                    break;
                // We should never see these here:
                case ResultWas::Info:
                case ResultWas::Warning:
                case ResultWas::Ok:
                case ResultWas::Unknown:
                case ResultWas::FailureBit:
                case ResultWas::Exception:
                    elementName = "internalError";
                    break;
            }

            XmlWriter::ScopedElement e = xml.scopedElement( elementName );

            xml.writeAttribute( "message"_sr, result.getExpression() );
            xml.writeAttribute( "type"_sr, result.getTestMacroName() );

            ReusableStringStream rss;
            if ( result.getResultType() == ResultWas::ExplicitSkip ) {
                rss << "SKIPPED\n";
            } else {
                rss << "FAILED" << ":\n";
                if (result.hasExpression()) {
                    rss << "  ";
                    rss << result.getExpressionInMacro();
                    rss << '\n';
                }
                if (result.hasExpandedExpression()) {
                    rss << "with expansion:\n";
                    rss << TextFlow::Column(result.getExpandedExpression()).indent(2) << '\n';
                }
            }

            if( result.hasMessage() )
                rss << result.getMessage() << '\n';
            for( auto const& msg : stats.infoMessages )
                if( msg.type == ResultWas::Info )
                    rss << msg.message << '\n';

            rss << "at " << result.getSourceInfo();
            xml.writeText( rss.str(), XmlFormatting::Newline );
        }
    }